

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::printReadable(CFG *this)

{
  pointer ppPVar1;
  Production *pPVar2;
  pointer pbVar3;
  ostream *poVar4;
  pointer pbVar5;
  char *pcVar6;
  pointer ppPVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> el;
  string local_50;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pcVar6 = "Nonterminals: ";
  poVar4 = std::operator<<((ostream *)&std::cout,"Nonterminals: ");
  vecToStr(&local_50,(CFG *)pcVar6,&this->nonTerminalsV);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar6 = "Terminals: ";
  poVar4 = std::operator<<((ostream *)&std::cout,"Terminals: ");
  vecToStr(&local_50,(CFG *)pcVar6,&this->terminalsT);
  poVar4 = std::operator<<(poVar4,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_50);
  poVar4 = std::operator<<((ostream *)&std::cout,"Productions: ");
  std::endl<char,std::char_traits<char>>(poVar4);
  ppPVar1 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar7 = (this->productionsP).
                 super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar7 != ppPVar1; ppPVar7 = ppPVar7 + 1) {
    pPVar2 = *ppPVar7;
    poVar4 = std::operator<<((ostream *)&std::cout,"\t");
    poVar4 = std::operator<<(poVar4,(string *)pPVar2);
    std::operator<<(poVar4," -> ");
    pbVar3 = (pPVar2->toP).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (pPVar2->toP).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar3; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
      std::operator<<((ostream *)&std::cout,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Startsymbol: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->startS);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void CFG::printReadable() {
    std::cout << std::endl;

    std::cout << "Nonterminals: " << vecToStr(nonTerminalsV) << std::endl;

    std::cout << "Terminals: " << vecToStr(terminalsT) << std::endl;

    std::cout << "Productions: " << std::endl;
    for (Production *production: productionsP) {
        std::cout << "\t" << production->getFromP() << " -> ";
        for (auto el: production->getToP()) {
            std::cout << el;
        }
        std::cout << std::endl;
    }

    std::cout << "Startsymbol: " << startS << std::endl;
    std::cout << std::endl;
}